

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsFederate
helicsCreateCallbackFederate(char *fedName,HelicsFederateInfo fedInfo,HelicsError *err)

{
  FederateInfo *pFVar1;
  HelicsFederate pvVar2;
  allocator<char> local_219;
  shared_ptr<helics::Federate> fed;
  undefined1 local_208 [32];
  undefined1 local_1e8 [40];
  FederateInfo local_1c0;
  
  if ((err != (HelicsError *)0x0) && (err->error_code != 0)) {
    return (HelicsFederate)0x0;
  }
  fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (fedInfo == (HelicsFederateInfo)0x0) {
    if (fedName == (char *)0x0) {
      std::__cxx11::string::string((string *)local_208,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_208,fedName,&local_219);
    }
    helics::FederateInfo::FederateInfo(&local_1c0);
    std::make_shared<helics::CallbackFederate,std::__cxx11::string_const,helics::FederateInfo>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
               (FederateInfo *)local_208);
    std::__shared_ptr<helics::Federate,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Federate,(__gnu_cxx::_Lock_policy)2> *)&fed,
               (__shared_ptr<helics::CallbackFederate,_(__gnu_cxx::_Lock_policy)2> *)local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
    helics::FederateInfo::~FederateInfo(&local_1c0);
    pFVar1 = (FederateInfo *)local_208;
  }
  else {
    pFVar1 = getFedInfo(fedInfo,err);
    if (pFVar1 == (FederateInfo *)0x0) {
      pvVar2 = (HelicsFederate)0x0;
      goto LAB_0017dd2c;
    }
    if (fedName == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1c0,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,fedName,(allocator<char> *)local_1e8);
    }
    std::make_shared<helics::CallbackFederate,std::__cxx11::string_const,helics::FederateInfo&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
               &local_1c0);
    std::__shared_ptr<helics::Federate,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Federate,(__gnu_cxx::_Lock_policy)2> *)&fed,
               (__shared_ptr<helics::CallbackFederate,_(__gnu_cxx::_Lock_policy)2> *)local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
    pFVar1 = &local_1c0;
  }
  std::__cxx11::string::~string((string *)pFVar1);
  local_1e8._16_8_ = fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1e8._24_8_ =
       fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pvVar2 = generateNewHelicsFederateObject
                     ((shared_ptr<helics::Federate> *)(local_1e8 + 0x10),CALLBACK);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 0x18));
LAB_0017dd2c:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return pvVar2;
}

Assistant:

HelicsFederate helicsCreateCallbackFederate(const char* fedName, HelicsFederateInfo fedInfo, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    std::shared_ptr<helics::Federate> fed;
    try {
        if (fedInfo == nullptr) {
            fed = std::make_shared<helics::CallbackFederate>(AS_STRING(fedName), helics::FederateInfo());
        } else {
            auto* info = getFedInfo(fedInfo, err);
            if (info == nullptr) {
                return nullptr;
            }
            fed = std::make_shared<helics::CallbackFederate>(AS_STRING(fedName), *info);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    return generateNewHelicsFederateObject(std::move(fed), helics::FederateType::CALLBACK);
}